

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O0

void anurbs::MeshMapper<3L>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::MeshMapper<3l>> *this;
  arg aVar1;
  undefined1 local_d8;
  arg local_d0;
  arg local_c0;
  arg local_b0;
  code *local_a0;
  undefined8 local_98;
  arg local_90;
  arg local_80;
  arg local_70;
  arg local_60;
  constructor<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_&,_Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_&>
  local_4d [13];
  handle local_40;
  class_<anurbs::MeshMapper<3L>_> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  MeshMapper<3l>::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::MeshMapper<3L>_>::class_<>(&local_38,local_40,name_00);
  pybind11::
  init<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&,Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&>
            ();
  local_70 = pybind11::literals::operator____a("vertices",8);
  local_60.name = local_70.name;
  local_60._8_1_ = local_70._8_1_;
  local_90 = pybind11::literals::operator____a("faces",5);
  local_80.name = local_90.name;
  local_80._8_1_ = local_90._8_1_;
  this = (class_<anurbs::MeshMapper<3l>> *)
         pybind11::class_<anurbs::MeshMapper<3l>>::
         def<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&,Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>&,pybind11::arg,pybind11::arg>
                   ((class_<anurbs::MeshMapper<3l>> *)&local_38,local_4d,&local_60,&local_80);
  local_a0 = map;
  local_98 = 0;
  local_c0 = pybind11::literals::operator____a("point",5);
  local_b0.name = local_c0.name;
  local_b0._8_1_ = local_c0._8_1_;
  aVar1 = pybind11::literals::operator____a("max_distance",0xc);
  local_d0.name = aVar1.name;
  local_d8 = aVar1._8_1_;
  local_d0._8_1_ = local_d8;
  pybind11::class_<anurbs::MeshMapper<3l>>::
  def<std::tuple<bool,Eigen::Matrix<double,1,3,1,1,3>,std::pair<long,Eigen::Matrix<double,1,3,1,1,3>>,double>(anurbs::MeshMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            (this,"map",(offset_in_Model_to_subr *)&local_a0,&local_b0,&local_d0);
  pybind11::class_<anurbs::MeshMapper<3L>_>::~class_(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Eigen::Ref<const Vertices>&, Eigen::Ref<const Faces>&>(), "vertices"_a, "faces"_a)
            // methods
            .def("map", &Type::map, "point"_a, "max_distance"_a);
    }